

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.h
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeBodyBushingGeneric::ChLoadXYZROTnodeBodyBushingGeneric
          (ChLoadXYZROTnodeBodyBushingGeneric *this,ChLoadXYZROTnodeBodyBushingGeneric *param_1)

{
  ChLoadXYZROTnodeBody::ChLoadXYZROTnodeBody
            (&this->super_ChLoadXYZROTnodeBody,&param_1->super_ChLoadXYZROTnodeBody);
  (this->super_ChLoadXYZROTnodeBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadXYZROTnodeBodyBushingGeneric_01177588;
  memcpy(&this->stiffness,&param_1->stiffness,0x120);
  memcpy(&this->damping,&param_1->damping,0x120);
  (this->neutral_force).m_data[0] = (param_1->neutral_force).m_data[0];
  (this->neutral_force).m_data[1] = (param_1->neutral_force).m_data[1];
  (this->neutral_force).m_data[2] = (param_1->neutral_force).m_data[2];
  (this->neutral_torque).m_data[0] = (param_1->neutral_torque).m_data[0];
  (this->neutral_torque).m_data[1] = (param_1->neutral_torque).m_data[1];
  (this->neutral_torque).m_data[2] = (param_1->neutral_torque).m_data[2];
  ChFrame<double>::ChFrame(&this->neutral_displacement,&param_1->neutral_displacement);
  return;
}

Assistant:

class ChApi ChLoadXYZROTnodeBodyBushingGeneric : public ChLoadXYZROTnodeBody {
  public:
    ChLoadXYZROTnodeBodyBushingGeneric(
        std::shared_ptr<ChNodeFEAxyzrot> mnodeA,  ///< node A
        std::shared_ptr<ChBody> mbodyB,           ///< body B
        const ChFrame<>& abs_application,         ///< create the bushing here, in abs. coordinates.
        ChMatrixConstRef mstiffness,              ///< stiffness as a 6x6 matrix, local in the abs_application frame
        ChMatrixConstRef mdamping                 ///< damping as a 6x6 matrix, local in the abs_application frame
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadXYZROTnodeBodyBushingGeneric* Clone() const override {
        return new ChLoadXYZROTnodeBodyBushingGeneric(*this);
    }

    /// Set a generic 6x6 stiffness matrix, expressed in local
    /// coordinate system of loc_application_B.
    void SetStiffnessMatrix(ChMatrixConstRef mstiffness) { stiffness = mstiffness; }
    const ChMatrixNM<double, 6, 6>& GetStiffnessMatrix() const { return stiffness; }

    /// Set a generic 6x6 damping matrix, expressed in local
    /// coordinate system of loc_application_B.
    void SetDampingMatrix(ChMatrixConstRef mdamping) { damping = mdamping; }
    const ChMatrixNM<double, 6, 6>& GetDampingMatrix() const { return damping; }

    /// Set the initial pre-load of the bushing, applied to loc_application_A,
    /// expressed in local coordinate system of loc_application_B.
    /// By default it is zero.
    void SetNeutralForce(const ChVector<> mf) { neutral_force = mf; }
    ChVector<> GetNeutralForce() const { return neutral_force; }

    /// Set the initial pre-load torque of the bushing, applied to loc_application_A,
    /// expressed in local coordinate system of loc_application_B.
    /// By default it is zero.
    void SetNeutralTorque(const ChVector<> mt) { neutral_torque = mt; }
    ChVector<> GetNeutralTorque() const { return neutral_torque; }

    /// Set/get the initial pre-displacement of the bushing, as the pre-displacement
    /// of A, expressed in local coordinate system of loc_application_B.
    /// Default behavior is no initial pre-displacement.
    ChFrame<>& NeutralDisplacement() { return neutral_displacement; }

  protected:
    ChMatrixNM<double, 6, 6> stiffness;
    ChMatrixNM<double, 6, 6> damping;

    ChVector<> neutral_force;
    ChVector<> neutral_torque;
    ChFrame<> neutral_displacement;

    virtual bool IsStiff() override { return true; }

    /// Compute the wrench (force & torque) between the two nodes, expressed in local frame of loc_application_B,
    /// given rel_AB, i.e. the position and speed of loc_application_A respect to loc_application_B, expressed in frame
    /// of loc_application_B. Force is assumed applied to loc_application_B, and its opposite reaction to A.
    virtual void ComputeForceTorque(const ChFrameMoving<>& rel_AB,
                                    ChVector<>& loc_force,
                                    ChVector<>& loc_torque) override;

  public:
    EIGEN_MAKE_ALIGNED_OPERATOR_NEW
};

}